

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_part.cpp
# Opt level: O0

undefined8 duckdb::DecadeFun::GetFunctions(void)

{
  undefined8 in_RDI;
  
  GetDatePartFunction<duckdb::DatePart::DecadeOperator>();
  return in_RDI;
}

Assistant:

ScalarFunctionSet DecadeFun::GetFunctions() {
	return GetDatePartFunction<DatePart::DecadeOperator>();
}